

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::iterate(InterCallTestCase *this)

{
  TestContext *this_00;
  int iVar1;
  bool bVar2;
  TestLog *this_01;
  MessageBuilder *this_02;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  allocator<char> local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  int local_1a8;
  int step;
  MessageBuilder local_198;
  int local_18 [2];
  int resultStorageFriendlyName;
  int programFriendlyName;
  InterCallTestCase *this_local;
  
  local_18[1] = 0;
  local_18[0] = 0;
  _resultStorageFriendlyName = this;
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [20])"Running operations:");
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  for (local_1a8 = 0; iVar1 = local_1a8,
      sVar3 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
              ::size(&this->m_cmds), iVar1 < (int)sVar3; local_1a8 = local_1a8 + 1) {
    pvVar4 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
             ::operator[](&this->m_cmds,(long)local_1a8);
    switch(pvVar4->type) {
    case TYPE_WRITE:
      pvVar4 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)local_1a8);
      runCommand(this,&(pvVar4->u_cmd).write,local_1a8,local_18 + 1);
      break;
    case TYPE_READ:
      pvVar4 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)local_1a8);
      runCommand(this,&(pvVar4->u_cmd).read,local_1a8,local_18 + 1,local_18);
      break;
    case TYPE_BARRIER:
      pvVar4 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)local_1a8);
      runCommand(this,(Barrier *)&(pvVar4->u_cmd).write);
      break;
    case TYPE_READ_MULTIPLE:
      pvVar4 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)local_1a8);
      runCommand(this,&(pvVar4->u_cmd).readMulti,local_1a8,local_18 + 1,local_18);
      break;
    case TYPE_WRITE_INTERLEAVE:
      pvVar4 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)local_1a8);
      runCommand(this,&(pvVar4->u_cmd).writeInterleave,local_1a8,local_18 + 1);
      break;
    case TYPE_READ_INTERLEAVE:
      pvVar4 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)local_1a8);
      runCommand(this,&(pvVar4->u_cmd).readInterleave,local_1a8,local_18 + 1,local_18);
      break;
    case TYPE_READ_ZERO:
      pvVar4 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               ::operator[](&this->m_cmds,(long)local_1a8);
      runCommand(this,&(pvVar4->u_cmd).readZero,local_1a8,local_18 + 1,local_18);
    }
  }
  bVar2 = verifyResults(this);
  if (bVar2) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar5 = "image";
    if (this->m_storage == STORAGE_BUFFER) {
      pcVar5 = "buffer";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar5,&local_1e9);
    std::operator+(&local_1c8,&local_1e8," content verification failed");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,pcVar5);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
  }
  return STOP;
}

Assistant:

InterCallTestCase::IterateResult InterCallTestCase::iterate (void)
{
	int programFriendlyName			= 0;
	int resultStorageFriendlyName	= 0;

	m_testCtx.getLog() << tcu::TestLog::Message << "Running operations:" << tcu::TestLog::EndMessage;

	// run steps

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		switch (m_cmds[step].type)
		{
			case InterCallOperations::Command::TYPE_WRITE:				runCommand(m_cmds[step].u_cmd.write,			step,	programFriendlyName);								break;
			case InterCallOperations::Command::TYPE_READ:				runCommand(m_cmds[step].u_cmd.read,				step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_BARRIER:			runCommand(m_cmds[step].u_cmd.barrier);																		break;
			case InterCallOperations::Command::TYPE_READ_MULTIPLE:		runCommand(m_cmds[step].u_cmd.readMulti,		step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_WRITE_INTERLEAVE:	runCommand(m_cmds[step].u_cmd.writeInterleave,	step,	programFriendlyName);								break;
			case InterCallOperations::Command::TYPE_READ_INTERLEAVE:	runCommand(m_cmds[step].u_cmd.readInterleave,	step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_READ_ZERO:			runCommand(m_cmds[step].u_cmd.readZero,			step,	programFriendlyName, resultStorageFriendlyName);	break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	// read results from result buffers
	if (verifyResults())
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, (std::string((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) + " content verification failed").c_str());

	return STOP;
}